

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void __thiscall
MemoryLeakWarningPlugin::MemoryLeakWarningPlugin
          (MemoryLeakWarningPlugin *this,SimpleString *name,MemoryLeakDetector *localDetector)

{
  MemoryLeakDetector *pMVar1;
  MemoryLeakDetector *in_RDX;
  MemoryLeakWarningPlugin *in_RDI;
  SimpleString *in_stack_ffffffffffffffc8;
  
  TestPlugin::TestPlugin(&in_RDI->super_TestPlugin,in_stack_ffffffffffffffc8);
  (in_RDI->super_TestPlugin)._vptr_TestPlugin = (_func_int **)&PTR__MemoryLeakWarningPlugin_00138fb8
  ;
  in_RDI->ignoreAllWarnings_ = false;
  in_RDI->destroyGlobalDetectorAndTurnOfMemoryLeakDetectionInDestructor_ = false;
  in_RDI->expectedLeaks_ = 0;
  if (firstPlugin_ == (MemoryLeakWarningPlugin *)0x0) {
    firstPlugin_ = in_RDI;
  }
  if (in_RDX == (MemoryLeakDetector *)0x0) {
    pMVar1 = getGlobalDetector();
    in_RDI->memLeakDetector_ = pMVar1;
  }
  else {
    in_RDI->memLeakDetector_ = in_RDX;
  }
  MemoryLeakDetector::enable(in_RDI->memLeakDetector_);
  return;
}

Assistant:

MemoryLeakWarningPlugin::MemoryLeakWarningPlugin(const SimpleString& name, MemoryLeakDetector* localDetector) :
    TestPlugin(name), ignoreAllWarnings_(false), destroyGlobalDetectorAndTurnOfMemoryLeakDetectionInDestructor_(false), expectedLeaks_(0)
{
    if (firstPlugin_ == NULLPTR) firstPlugin_ = this;

    if (localDetector) memLeakDetector_ = localDetector;
    else memLeakDetector_ = getGlobalDetector();

    memLeakDetector_->enable();
}